

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::CLUFactor<double>::vSolveRight4update
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn,
          double *forest,int *forestNum,int *forestIdx)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *vec_00;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint local_44;
  double local_40;
  double *local_38;
  
  local_44 = rn;
  local_40 = eps;
  local_38 = vec;
  vSolveLright(this,rhs,ridx,(int *)&local_44,eps);
  vec_00 = local_38;
  piVar4 = (this->row).perm;
  uVar5 = (ulong)local_44;
  if (forest == (double *)0x0) {
    if ((int)local_44 < 1) {
      local_44 = 0;
    }
    else {
      uVar8 = 0;
      local_44 = 0;
      do {
        iVar2 = ridx[uVar8];
        if (ABS(rhs[iVar2]) <= local_40) {
          rhs[iVar2] = 0.0;
        }
        else {
          iVar2 = piVar4[iVar2];
          uVar7 = local_44;
          if (0 < (int)local_44) {
            do {
              uVar6 = uVar7 - 1;
              uVar10 = uVar6 >> 1;
              if (iVar2 <= ridx[uVar10]) break;
              ridx[uVar7] = ridx[uVar10];
              uVar7 = uVar10;
            } while (1 < uVar6);
          }
          local_44 = local_44 + 1;
          ridx[(int)uVar7] = iVar2;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar5);
    }
  }
  else {
    if ((int)local_44 < 1) {
      uVar7 = 0;
    }
    else {
      lVar9 = 0;
      uVar7 = 0;
      do {
        iVar2 = ridx[lVar9];
        dVar1 = rhs[iVar2];
        if (ABS(dVar1) <= local_40) {
          rhs[iVar2] = 0.0;
        }
        else {
          *forestIdx = iVar2;
          iVar3 = piVar4[iVar2];
          uVar10 = uVar7;
          if (0 < (int)uVar7) {
            do {
              uVar6 = uVar10 - 1;
              uVar11 = uVar6 >> 1;
              if (iVar3 <= ridx[uVar11]) break;
              ridx[uVar10] = ridx[uVar11];
              uVar10 = uVar11;
            } while (1 < uVar6);
          }
          forestIdx = forestIdx + 1;
          uVar7 = uVar7 + 1;
          ridx[(int)uVar10] = iVar3;
          forest[iVar2] = dVar1;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)local_44);
    }
    *forestNum = uVar7;
    local_44 = uVar7;
  }
  local_44 = vSolveUright(this,local_38,idx,rhs,ridx,local_44,local_40);
  if ((this->l).updateType == 0) {
    local_44 = vSolveUpdateRight(this,vec_00,idx,local_44,local_40);
  }
  return local_44;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}